

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void luaC_fullgc(lua_State *L,int isemergency)

{
  global_State *g_00;
  global_State *g;
  int isemergency_local;
  lua_State *L_local;
  
  g_00 = L->l_G;
  if (g_00->gcemergency == '\0') {
    g_00->gcemergency = (lu_byte)isemergency;
    if (g_00->gckind == '\0') {
      fullinc(L,g_00);
    }
    else {
      fullgen(L,g_00);
    }
    g_00->gcemergency = '\0';
    return;
  }
  __assert_fail("!g->gcemergency",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                ,0x71e,"void luaC_fullgc(lua_State *, int)");
}

Assistant:

void luaC_fullgc (lua_State *L, int isemergency) {
  global_State *g = G(L);
  lua_assert(!g->gcemergency);
  g->gcemergency = isemergency;  /* set flag */
  if (g->gckind == KGC_INC)
    fullinc(L, g);
  else
    fullgen(L, g);
  g->gcemergency = 0;
}